

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int ncnn::binary_op_broadcast_20(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [64];
  uint in_EAX;
  int iVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  ulong uVar43;
  long lVar44;
  float *pfVar45;
  int iVar46;
  undefined1 (*pauVar47) [64];
  float *pfVar48;
  undefined1 (*pauVar49) [64];
  uint uVar50;
  undefined1 (*pauVar51) [64];
  long lVar52;
  float *pfVar53;
  long lVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar84 [16];
  float fVar83;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [56];
  __m512 afVar87;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 in_ZMM3 [64];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar92 [64];
  __m128 afVar93;
  binary_op_ratan2 op;
  __m256 _p1;
  __m256 _p;
  binary_op_ratan2 local_149;
  Mat *local_148;
  uint local_140;
  uint local_13c;
  long local_138;
  uint local_12c;
  undefined8 local_128;
  undefined1 (*local_120) [64];
  Mat *local_118;
  Mat *local_110;
  long local_108;
  undefined1 local_100 [32];
  undefined1 auStack_e0 [32];
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  auVar55 = in_ZMM24._0_16_;
  local_148 = a;
  local_118 = c;
  local_110 = b;
  switch(op_type) {
  case 0:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vaddps_avx512f(*pauVar49,*pauVar51);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar85._0_4_ = *(float *)*pauVar49 + *(float *)*pauVar51;
              auVar85._4_4_ = *(float *)(*pauVar49 + 4) + *(float *)(*pauVar51 + 4);
              auVar85._8_4_ = *(float *)(*pauVar49 + 8) + *(float *)(*pauVar51 + 8);
              auVar85._12_4_ = *(float *)(*pauVar49 + 0xc) + *(float *)(*pauVar51 + 0xc);
              auVar85._16_4_ = *(float *)(*pauVar49 + 0x10) + *(float *)(*pauVar51 + 0x10);
              auVar85._20_4_ = *(float *)(*pauVar49 + 0x14) + *(float *)(*pauVar51 + 0x14);
              auVar85._24_4_ = *(float *)(*pauVar49 + 0x18) + *(float *)(*pauVar51 + 0x18);
              auVar85._28_4_ = *(float *)(*pauVar49 + 0x1c) + *(float *)(*pauVar51 + 0x1c);
              *(undefined1 (*) [32])*pauVar47 = auVar85;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar84._0_4_ = *(float *)*pauVar49 + *(float *)*pauVar51;
              auVar84._4_4_ = *(float *)(*pauVar49 + 4) + *(float *)(*pauVar51 + 4);
              auVar84._8_4_ = *(float *)(*pauVar49 + 8) + *(float *)(*pauVar51 + 8);
              auVar84._12_4_ = *(float *)(*pauVar49 + 0xc) + *(float *)(*pauVar51 + 0xc);
              *(undefined1 (*) [16])*pauVar47 = auVar84;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                *(float *)((long)*pauVar47 + lVar54 * 4) =
                     *(float *)(*pauVar49 + lVar54 * 4) + *(float *)(*pauVar51 + lVar54 * 4);
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 1:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vsubps_avx512f(*pauVar51,*pauVar49);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar86 = vsubps_avx(*(undefined1 (*) [32])*pauVar51,*(undefined1 (*) [32])*pauVar49);
              *(undefined1 (*) [32])*pauVar47 = auVar86;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar55 = vsubps_avx(*(undefined1 (*) [16])*pauVar51,*(undefined1 (*) [16])*pauVar49);
              *(undefined1 (*) [16])*pauVar47 = auVar55;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                *(float *)((long)*pauVar47 + lVar54 * 4) =
                     *(float *)(*pauVar51 + lVar54 * 4) - *(float *)(*pauVar49 + lVar54 * 4);
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 2:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vmulps_avx512f(*pauVar49,*pauVar51);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar86._4_4_ = *(float *)(*pauVar49 + 4) * *(float *)(*pauVar51 + 4);
              auVar86._0_4_ = *(float *)*pauVar49 * *(float *)*pauVar51;
              auVar86._8_4_ = *(float *)(*pauVar49 + 8) * *(float *)(*pauVar51 + 8);
              auVar86._12_4_ = *(float *)(*pauVar49 + 0xc) * *(float *)(*pauVar51 + 0xc);
              auVar86._16_4_ = *(float *)(*pauVar49 + 0x10) * *(float *)(*pauVar51 + 0x10);
              auVar86._20_4_ = *(float *)(*pauVar49 + 0x14) * *(float *)(*pauVar51 + 0x14);
              auVar86._24_4_ = *(float *)(*pauVar49 + 0x18) * *(float *)(*pauVar51 + 0x18);
              auVar86._28_4_ = *(undefined4 *)(*pauVar49 + 0x1c);
              *(undefined1 (*) [32])*pauVar47 = auVar86;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar55._0_4_ = *(float *)*pauVar49 * *(float *)*pauVar51;
              auVar55._4_4_ = *(float *)(*pauVar49 + 4) * *(float *)(*pauVar51 + 4);
              auVar55._8_4_ = *(float *)(*pauVar49 + 8) * *(float *)(*pauVar51 + 8);
              auVar55._12_4_ = *(float *)(*pauVar49 + 0xc) * *(float *)(*pauVar51 + 0xc);
              *(undefined1 (*) [16])*pauVar47 = auVar55;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                *(float *)((long)*pauVar47 + lVar54 * 4) =
                     *(float *)(*pauVar49 + lVar54 * 4) * *(float *)(*pauVar51 + lVar54 * 4);
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 3:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vrcp14ps_avx512f(*pauVar49);
                in_ZMM3 = vmulps_avx512f(*pauVar51,auVar56);
                auVar57 = vfmsub213ps_avx512f(*pauVar49,in_ZMM3,*pauVar51);
                auVar56 = vfnmadd213ps_avx512f(auVar57,auVar56,in_ZMM3);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar85 = vrcpps_avx(*(undefined1 (*) [32])*pauVar49);
              auVar86 = *(undefined1 (*) [32])*pauVar51;
              auVar61._0_4_ = auVar86._0_4_ * auVar85._0_4_;
              auVar61._4_4_ = auVar86._4_4_ * auVar85._4_4_;
              auVar61._8_4_ = auVar86._8_4_ * auVar85._8_4_;
              auVar61._12_4_ = auVar86._12_4_ * auVar85._12_4_;
              auVar61._16_4_ = auVar86._16_4_ * auVar85._16_4_;
              auVar61._20_4_ = auVar86._20_4_ * auVar85._20_4_;
              auVar61._28_36_ = in_ZMM3._28_36_;
              auVar61._24_4_ = auVar86._24_4_ * auVar85._24_4_;
              auVar91 = auVar61._0_32_;
              in_ZMM3 = ZEXT3264(auVar91);
              auVar55 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar49,auVar91,auVar86);
              auVar55 = vfnmadd213ps_fma(ZEXT1632(auVar55),auVar85,auVar91);
              *(undefined1 (*) [32])*pauVar47 = ZEXT1632(auVar55);
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar55 = *(undefined1 (*) [16])*pauVar51;
              auVar84 = vrcpps_avx(*(undefined1 (*) [16])*pauVar49);
              auVar89._0_4_ = auVar55._0_4_ * auVar84._0_4_;
              auVar89._4_4_ = auVar55._4_4_ * auVar84._4_4_;
              auVar89._8_4_ = auVar55._8_4_ * auVar84._8_4_;
              auVar89._12_4_ = auVar55._12_4_ * auVar84._12_4_;
              in_ZMM3 = ZEXT1664(auVar89);
              auVar55 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar49,auVar89,auVar55);
              auVar55 = vfnmadd213ps_fma(auVar55,auVar84,auVar89);
              *(undefined1 (*) [16])*pauVar47 = auVar55;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                *(float *)((long)*pauVar47 + lVar54 * 4) =
                     *(float *)(*pauVar51 + lVar54 * 4) / *(float *)(*pauVar49 + lVar54 * 4);
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 4:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vmaxps_avx512f(*pauVar51,*pauVar49);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar86 = vmaxps_avx(*(undefined1 (*) [32])*pauVar51,*(undefined1 (*) [32])*pauVar49);
              *(undefined1 (*) [32])*pauVar47 = auVar86;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar55 = vmaxps_avx(*(undefined1 (*) [16])*pauVar51,*(undefined1 (*) [16])*pauVar49);
              *(undefined1 (*) [16])*pauVar47 = auVar55;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                auVar55 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar49 + lVar54 * 4)),
                                     ZEXT416(*(uint *)(*pauVar51 + lVar54 * 4)));
                *(int *)((long)*pauVar47 + lVar54 * 4) = auVar55._0_4_;
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 5:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vminps_avx512f(*pauVar51,*pauVar49);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar86 = vminps_avx(*(undefined1 (*) [32])*pauVar51,*(undefined1 (*) [32])*pauVar49);
              *(undefined1 (*) [32])*pauVar47 = auVar86;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar55 = vminps_avx(*(undefined1 (*) [16])*pauVar51,*(undefined1 (*) [16])*pauVar49);
              *(undefined1 (*) [16])*pauVar47 = auVar55;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                auVar55 = vminss_avx(ZEXT416(*(uint *)(*pauVar49 + lVar54 * 4)),
                                     ZEXT416(*(uint *)(*pauVar51 + lVar54 * 4)));
                *(int *)((long)*pauVar47 + lVar54 * 4) = auVar55._0_4_;
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 6:
    in_EAX = a->c;
    local_128 = (ulong)(int)in_EAX;
    if (0 < (long)local_128) {
      local_12c = a->h;
      uVar50 = a->w * a->elempack;
      local_138 = 0;
      local_140 = uVar50;
      do {
        if (0 < (int)local_12c) {
          pfVar53 = (float *)(local_118->cstep * local_138 * local_118->elemsize +
                             (long)local_118->data);
          pfVar45 = (float *)(local_148->cstep * local_138 * local_148->elemsize +
                             (long)local_148->data);
          a = (Mat *)0x0;
          do {
            local_13c = (uint)a;
            pfVar48 = (float *)(b->cstep * local_138 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              uVar50 = 0;
              do {
                local_c0 = *(float (*) [2])pfVar45;
                afStack_b8 = *(float (*) [2])(pfVar45 + 2);
                afStack_b0 = *(float (*) [2])(pfVar45 + 4);
                afStack_a8 = *(float (*) [2])(pfVar45 + 6);
                afStack_a0 = *(float (*) [2])(pfVar45 + 8);
                afStack_98 = *(float (*) [2])(pfVar45 + 10);
                afStack_90 = *(float (*) [2])(pfVar45 + 0xc);
                afStack_88._0_8_ = *(undefined8 *)(pfVar45 + 0xe);
                afVar87 = *(__m512 *)pfVar48;
                _local_100 = afVar87;
                BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                          ((binary_op_pow *)&local_149,(__m512 *)local_c0,(__m512 *)local_100);
                *(__m512 *)pfVar53 = afVar87;
                pfVar45 = pfVar45 + 0x10;
                pfVar48 = pfVar48 + 0x10;
                pfVar53 = pfVar53 + 0x10;
                uVar41 = uVar50 + 0x10;
                iVar39 = uVar50 + 0x1f;
                uVar50 = uVar41;
              } while (iVar39 < (int)local_140);
            }
            uVar50 = local_140;
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              local_c0 = *(float (*) [2])pfVar45;
              afStack_b8 = *(float (*) [2])(pfVar45 + 2);
              afStack_b0 = *(float (*) [2])(pfVar45 + 4);
              afStack_a8 = *(float (*) [2])(pfVar45 + 6);
              auVar86 = *(undefined1 (*) [32])pfVar48;
              local_100._0_4_ = auVar86._0_4_;
              local_100._4_4_ = auVar86._4_4_;
              local_100._8_4_ = auVar86._8_4_;
              local_100._12_4_ = auVar86._12_4_;
              local_100._16_4_ = auVar86._16_4_;
              local_100._20_4_ = auVar86._20_4_;
              local_100._24_4_ = auVar86._24_4_;
              local_100._28_4_ = auVar86._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                        ((binary_op_pow *)&local_149,(__m256 *)local_c0,(__m256 *)local_100);
              *(undefined1 (*) [32])pfVar53 = auVar86;
              pfVar45 = pfVar45 + 8;
              pfVar48 = pfVar48 + 8;
              pfVar53 = pfVar53 + 8;
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              local_c0 = *(float (*) [2])pfVar45;
              afStack_b8 = *(float (*) [2])(pfVar45 + 2);
              local_100._0_16_ = *(undefined1 (*) [16])pfVar48;
              auVar88 = ZEXT856(*(ulong *)(pfVar48 + 2));
              afVar93 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                                  ((binary_op_pow *)&local_149,(__m128 *)local_c0,
                                   (__m128 *)local_100);
              auVar60._0_8_ = afVar93._0_8_;
              auVar60._8_56_ = auVar88;
              *(undefined1 (*) [16])pfVar53 = auVar60._0_16_;
              pfVar45 = pfVar45 + 4;
              pfVar48 = pfVar48 + 4;
              pfVar53 = pfVar53 + 4;
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar52 = 0;
              lVar44 = 0;
              local_120 = (undefined1 (*) [64])(ulong)(uVar50 - uVar41);
              do {
                fVar83 = powf(pfVar45[lVar52],pfVar48[lVar52]);
                pfVar53[lVar52] = fVar83;
                lVar44 = lVar44 + -4;
                lVar52 = lVar52 + 1;
              } while ((int)local_120 != (int)lVar52);
              pfVar45 = (float *)((long)pfVar45 - lVar44);
              pfVar53 = (float *)((long)pfVar53 - lVar44);
              uVar50 = local_140;
            }
            a = (Mat *)(ulong)(local_13c + 1);
            b = local_110;
          } while (local_13c + 1 != local_12c);
        }
        in_EAX = (uint)a;
        local_138 = local_138 + 1;
      } while (local_138 != local_128);
    }
    break;
  case 7:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vsubps_avx512f(*pauVar49,*pauVar51);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar86 = vsubps_avx(*(undefined1 (*) [32])*pauVar49,*(undefined1 (*) [32])*pauVar51);
              *(undefined1 (*) [32])*pauVar47 = auVar86;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar55 = vsubps_avx(*(undefined1 (*) [16])*pauVar49,*(undefined1 (*) [16])*pauVar51);
              *(undefined1 (*) [16])*pauVar47 = auVar55;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                *(float *)((long)*pauVar47 + lVar54 * 4) =
                     *(float *)(*pauVar49 + lVar54 * 4) - *(float *)(*pauVar51 + lVar54 * 4);
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 8:
    in_EAX = a->c;
    if (0 < (long)(int)in_EAX) {
      uVar50 = a->w * a->elempack;
      iVar39 = a->h;
      lVar44 = 0;
      do {
        if (0 < iVar39) {
          pauVar47 = (undefined1 (*) [64])(c->cstep * lVar44 * c->elemsize + (long)c->data);
          pauVar51 = (undefined1 (*) [64])(a->cstep * lVar44 * a->elemsize + (long)a->data);
          iVar46 = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * lVar44 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              iVar42 = 0xf;
              do {
                auVar56 = vrcp14ps_avx512f(*pauVar51);
                in_ZMM3 = vmulps_avx512f(*pauVar49,auVar56);
                auVar57 = vfmsub213ps_avx512f(*pauVar51,in_ZMM3,*pauVar49);
                auVar56 = vfnmadd213ps_avx512f(auVar57,auVar56,in_ZMM3);
                *pauVar47 = auVar56;
                pauVar51 = pauVar51 + 1;
                pauVar49 = pauVar49 + 1;
                pauVar47 = pauVar47 + 1;
                iVar42 = iVar42 + 0x10;
                uVar41 = uVar50 & 0xfffffff0;
              } while (iVar42 < (int)uVar50);
            }
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              auVar85 = vrcpps_avx(*(undefined1 (*) [32])*pauVar51);
              auVar86 = *(undefined1 (*) [32])*pauVar49;
              auVar59._0_4_ = auVar86._0_4_ * auVar85._0_4_;
              auVar59._4_4_ = auVar86._4_4_ * auVar85._4_4_;
              auVar59._8_4_ = auVar86._8_4_ * auVar85._8_4_;
              auVar59._12_4_ = auVar86._12_4_ * auVar85._12_4_;
              auVar59._16_4_ = auVar86._16_4_ * auVar85._16_4_;
              auVar59._20_4_ = auVar86._20_4_ * auVar85._20_4_;
              auVar59._28_36_ = in_ZMM3._28_36_;
              auVar59._24_4_ = auVar86._24_4_ * auVar85._24_4_;
              auVar91 = auVar59._0_32_;
              in_ZMM3 = ZEXT3264(auVar91);
              auVar55 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar51,auVar91,auVar86);
              auVar55 = vfnmadd213ps_fma(ZEXT1632(auVar55),auVar85,auVar91);
              *(undefined1 (*) [32])*pauVar47 = ZEXT1632(auVar55);
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x20);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x20);
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              auVar84 = vrcpps_avx(*(undefined1 (*) [16])*pauVar51);
              auVar55 = *(undefined1 (*) [16])*pauVar49;
              auVar90._0_4_ = auVar55._0_4_ * auVar84._0_4_;
              auVar90._4_4_ = auVar55._4_4_ * auVar84._4_4_;
              auVar90._8_4_ = auVar55._8_4_ * auVar84._8_4_;
              auVar90._12_4_ = auVar55._12_4_ * auVar84._12_4_;
              in_ZMM3 = ZEXT1664(auVar90);
              auVar55 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar51,auVar90,auVar55);
              auVar55 = vfnmadd213ps_fma(auVar55,auVar84,auVar90);
              *(undefined1 (*) [16])*pauVar47 = auVar55;
              pauVar51 = (undefined1 (*) [64])(*pauVar51 + 0x10);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar47 = (undefined1 (*) [64])((long)*pauVar47 + 0x10);
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar54 = 0;
              lVar52 = 0;
              do {
                *(float *)((long)*pauVar47 + lVar54 * 4) =
                     *(float *)(*pauVar49 + lVar54 * 4) / *(float *)(*pauVar51 + lVar54 * 4);
                lVar52 = lVar52 + -4;
                lVar54 = lVar54 + 1;
              } while (uVar50 - uVar41 != (int)lVar54);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar52);
              pauVar47 = (undefined1 (*) [64])((long)pauVar47 - lVar52);
            }
            iVar46 = iVar46 + 1;
          } while (iVar46 != iVar39);
        }
        lVar44 = lVar44 + 1;
      } while (lVar44 != (int)in_EAX);
    }
    break;
  case 9:
    in_EAX = a->c;
    local_128 = (ulong)(int)in_EAX;
    if (0 < (long)local_128) {
      local_12c = a->h;
      uVar50 = a->w * a->elempack;
      local_138 = 0;
      local_140 = uVar50;
      do {
        if (0 < (int)local_12c) {
          pfVar53 = (float *)(local_118->cstep * local_138 * local_118->elemsize +
                             (long)local_118->data);
          pfVar45 = (float *)(local_148->cstep * local_138 * local_148->elemsize +
                             (long)local_148->data);
          a = (Mat *)0x0;
          do {
            local_13c = (uint)a;
            pfVar48 = (float *)(b->cstep * local_138 * b->elemsize + (long)b->data);
            if ((int)uVar50 < 0x10) {
              uVar41 = 0;
            }
            else {
              uVar50 = 0;
              do {
                local_c0 = *(float (*) [2])pfVar45;
                afStack_b8 = *(float (*) [2])(pfVar45 + 2);
                afStack_b0 = *(float (*) [2])(pfVar45 + 4);
                afStack_a8 = *(float (*) [2])(pfVar45 + 6);
                afStack_a0 = *(float (*) [2])(pfVar45 + 8);
                afStack_98 = *(float (*) [2])(pfVar45 + 10);
                afStack_90 = *(float (*) [2])(pfVar45 + 0xc);
                afStack_88._0_8_ = *(undefined8 *)(pfVar45 + 0xe);
                afVar87 = *(__m512 *)pfVar48;
                _local_100 = afVar87;
                BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack16
                          ((binary_op_rpow *)&local_149,(__m512 *)local_c0,(__m512 *)local_100);
                *(__m512 *)pfVar53 = afVar87;
                pfVar45 = pfVar45 + 0x10;
                pfVar48 = pfVar48 + 0x10;
                pfVar53 = pfVar53 + 0x10;
                uVar41 = uVar50 + 0x10;
                iVar39 = uVar50 + 0x1f;
                uVar50 = uVar41;
              } while (iVar39 < (int)local_140);
            }
            uVar50 = local_140;
            uVar40 = uVar41 | 7;
            while ((int)uVar40 < (int)uVar50) {
              local_c0 = *(float (*) [2])pfVar45;
              afStack_b8 = *(float (*) [2])(pfVar45 + 2);
              afStack_b0 = *(float (*) [2])(pfVar45 + 4);
              afStack_a8 = *(float (*) [2])(pfVar45 + 6);
              auVar86 = *(undefined1 (*) [32])pfVar48;
              local_100._0_4_ = auVar86._0_4_;
              local_100._4_4_ = auVar86._4_4_;
              local_100._8_4_ = auVar86._8_4_;
              local_100._12_4_ = auVar86._12_4_;
              local_100._16_4_ = auVar86._16_4_;
              local_100._20_4_ = auVar86._20_4_;
              local_100._24_4_ = auVar86._24_4_;
              local_100._28_4_ = auVar86._28_4_;
              BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack8
                        ((binary_op_rpow *)&local_149,(__m256 *)local_c0,(__m256 *)local_100);
              *(undefined1 (*) [32])pfVar53 = auVar86;
              pfVar45 = pfVar45 + 8;
              pfVar48 = pfVar48 + 8;
              pfVar53 = pfVar53 + 8;
              uVar40 = uVar41 + 0xf;
              uVar41 = uVar41 + 8;
            }
            uVar40 = uVar41 | 3;
            while ((int)uVar40 < (int)uVar50) {
              local_c0 = *(float (*) [2])pfVar45;
              afStack_b8 = *(float (*) [2])(pfVar45 + 2);
              local_100._0_16_ = *(undefined1 (*) [16])pfVar48;
              auVar88 = ZEXT856(*(ulong *)(pfVar48 + 2));
              afVar93 = BinaryOp_x86_avx512_functor::binary_op_rpow::func_pack4
                                  ((binary_op_rpow *)&local_149,(__m128 *)local_c0,
                                   (__m128 *)local_100);
              auVar58._0_8_ = afVar93._0_8_;
              auVar58._8_56_ = auVar88;
              *(undefined1 (*) [16])pfVar53 = auVar58._0_16_;
              pfVar45 = pfVar45 + 4;
              pfVar48 = pfVar48 + 4;
              pfVar53 = pfVar53 + 4;
              uVar40 = uVar41 + 7;
              uVar41 = uVar41 + 4;
            }
            if (uVar50 - uVar41 != 0 && (int)uVar41 <= (int)uVar50) {
              lVar52 = 0;
              lVar44 = 0;
              local_120 = (undefined1 (*) [64])(ulong)(uVar50 - uVar41);
              do {
                fVar83 = powf(pfVar48[lVar52],pfVar45[lVar52]);
                pfVar53[lVar52] = fVar83;
                lVar44 = lVar44 + -4;
                lVar52 = lVar52 + 1;
              } while ((int)local_120 != (int)lVar52);
              pfVar45 = (float *)((long)pfVar45 - lVar44);
              pfVar53 = (float *)((long)pfVar53 - lVar44);
              uVar50 = local_140;
            }
            a = (Mat *)(ulong)(local_13c + 1);
            b = local_110;
          } while (local_13c + 1 != local_12c);
        }
        in_EAX = (uint)a;
        local_138 = local_138 + 1;
      } while (local_138 != local_128);
    }
    break;
  case 10:
    in_EAX = a->c;
    local_108 = (long)(int)in_EAX;
    if (0 < local_108) {
      uVar50 = a->h;
      uVar41 = a->w * a->elempack;
      in_EAX = uVar41 & 0xfffffff0;
      local_128 = CONCAT44(local_128._4_4_,uVar41) & 0xfffffffffffffff0;
      local_138 = 0;
      auVar56 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar58 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar59 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar60 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar61 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar62 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar63 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar64 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar65 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar66 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar67 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar68 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar69 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar70 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar55 = vxorps_avx512vl(auVar55,auVar55);
      auVar92 = ZEXT1664(auVar55);
      local_140 = uVar41;
      local_12c = uVar50;
      do {
        if (0 < (int)uVar50) {
          pauVar51 = (undefined1 (*) [64])
                     (local_118->cstep * local_138 * local_118->elemsize + (long)local_118->data);
          pauVar47 = (undefined1 (*) [64])
                     (local_148->cstep * local_138 * local_148->elemsize + (long)local_148->data);
          in_EAX = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * local_138 * b->elemsize + (long)b->data);
            if ((int)uVar41 < 0x10) {
              uVar43 = 0;
            }
            else {
              iVar39 = 0xf;
              do {
                auVar76 = *pauVar49;
                auVar77 = *pauVar47;
                auVar71 = vrcp14ps_avx512f(auVar76);
                auVar72 = vmulps_avx512f(auVar77,auVar71);
                auVar73 = vfmsub213ps_avx512f(auVar72,auVar76,auVar77);
                auVar71 = vfnmadd213ps_avx512f(auVar73,auVar71,auVar72);
                uVar43 = vcmpps_avx512f(auVar77,auVar92,1);
                auVar74 = vandps_avx512dq(auVar71,auVar58);
                auVar73._8_4_ = 0xc0490fdb;
                auVar73._0_8_ = 0xc0490fdbc0490fdb;
                auVar73._12_4_ = 0xc0490fdb;
                auVar73._16_4_ = 0xc0490fdb;
                auVar73._20_4_ = 0xc0490fdb;
                auVar73._24_4_ = 0xc0490fdb;
                auVar73._28_4_ = 0xc0490fdb;
                auVar73._32_4_ = 0xc0490fdb;
                auVar73._36_4_ = 0xc0490fdb;
                auVar73._40_4_ = 0xc0490fdb;
                auVar73._44_4_ = 0xc0490fdb;
                auVar73._48_4_ = 0xc0490fdb;
                auVar73._52_4_ = 0xc0490fdb;
                auVar73._56_4_ = 0xc0490fdb;
                auVar73._60_4_ = 0xc0490fdb;
                auVar73 = vblendmps_avx512f(auVar57,auVar73);
                bVar1 = (bool)((byte)uVar43 & 1);
                auVar78._0_4_ = (uint)bVar1 * auVar73._0_4_ | (uint)!bVar1 * auVar72._0_4_;
                bVar1 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar78._4_4_ = (uint)bVar1 * auVar73._4_4_ | (uint)!bVar1 * auVar72._4_4_;
                bVar1 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar78._8_4_ = (uint)bVar1 * auVar73._8_4_ | (uint)!bVar1 * auVar72._8_4_;
                bVar1 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar78._12_4_ = (uint)bVar1 * auVar73._12_4_ | (uint)!bVar1 * auVar72._12_4_;
                bVar1 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar78._16_4_ = (uint)bVar1 * auVar73._16_4_ | (uint)!bVar1 * auVar72._16_4_;
                bVar1 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar78._20_4_ = (uint)bVar1 * auVar73._20_4_ | (uint)!bVar1 * auVar72._20_4_;
                bVar1 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar78._24_4_ = (uint)bVar1 * auVar73._24_4_ | (uint)!bVar1 * auVar72._24_4_;
                bVar1 = (bool)((byte)(uVar43 >> 7) & 1);
                auVar78._28_4_ = (uint)bVar1 * auVar73._28_4_ | (uint)!bVar1 * auVar72._28_4_;
                bVar1 = (bool)((byte)(uVar43 >> 8) & 1);
                auVar78._32_4_ = (uint)bVar1 * auVar73._32_4_ | (uint)!bVar1 * auVar72._32_4_;
                bVar1 = (bool)((byte)(uVar43 >> 9) & 1);
                auVar78._36_4_ = (uint)bVar1 * auVar73._36_4_ | (uint)!bVar1 * auVar72._36_4_;
                bVar1 = (bool)((byte)(uVar43 >> 10) & 1);
                auVar78._40_4_ = (uint)bVar1 * auVar73._40_4_ | (uint)!bVar1 * auVar72._40_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xb) & 1);
                auVar78._44_4_ = (uint)bVar1 * auVar73._44_4_ | (uint)!bVar1 * auVar72._44_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xc) & 1);
                auVar78._48_4_ = (uint)bVar1 * auVar73._48_4_ | (uint)!bVar1 * auVar72._48_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xd) & 1);
                auVar78._52_4_ = (uint)bVar1 * auVar73._52_4_ | (uint)!bVar1 * auVar72._52_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xe) & 1);
                auVar78._56_4_ = (uint)bVar1 * auVar73._56_4_ | (uint)!bVar1 * auVar72._56_4_;
                bVar1 = SUB81(uVar43 >> 0xf,0);
                auVar78._60_4_ = (uint)bVar1 * auVar73._60_4_ | (uint)!bVar1 * auVar72._60_4_;
                uVar43 = vcmpps_avx512f(auVar59,auVar74,1);
                auVar38._8_4_ = 0xbf800000;
                auVar38._0_8_ = 0xbf800000bf800000;
                auVar38._12_4_ = 0xbf800000;
                auVar38._16_4_ = 0xbf800000;
                auVar38._20_4_ = 0xbf800000;
                auVar38._24_4_ = 0xbf800000;
                auVar38._28_4_ = 0xbf800000;
                auVar38._32_4_ = 0xbf800000;
                auVar38._36_4_ = 0xbf800000;
                auVar38._40_4_ = 0xbf800000;
                auVar38._44_4_ = 0xbf800000;
                auVar38._48_4_ = 0xbf800000;
                auVar38._52_4_ = 0xbf800000;
                auVar38._56_4_ = 0xbf800000;
                auVar38._60_4_ = 0xbf800000;
                auVar72 = vblendmps_avx512f(auVar74,auVar38);
                bVar1 = (bool)((byte)uVar43 & 1);
                auVar79._0_4_ = (uint)bVar1 * auVar72._0_4_ | (uint)!bVar1 * in_ZMM5._0_4_;
                bVar1 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar79._4_4_ = (uint)bVar1 * auVar72._4_4_ | (uint)!bVar1 * in_ZMM5._4_4_;
                bVar1 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar79._8_4_ = (uint)bVar1 * auVar72._8_4_ | (uint)!bVar1 * in_ZMM5._8_4_;
                bVar1 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar79._12_4_ = (uint)bVar1 * auVar72._12_4_ | (uint)!bVar1 * in_ZMM5._12_4_;
                bVar1 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar79._16_4_ = (uint)bVar1 * auVar72._16_4_ | (uint)!bVar1 * in_ZMM5._16_4_;
                bVar1 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar79._20_4_ = (uint)bVar1 * auVar72._20_4_ | (uint)!bVar1 * in_ZMM5._20_4_;
                bVar1 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar79._24_4_ = (uint)bVar1 * auVar72._24_4_ | (uint)!bVar1 * in_ZMM5._24_4_;
                bVar1 = (bool)((byte)(uVar43 >> 7) & 1);
                auVar79._28_4_ = (uint)bVar1 * auVar72._28_4_ | (uint)!bVar1 * in_ZMM5._28_4_;
                bVar18 = (byte)(uVar43 >> 8);
                bVar1 = (bool)(bVar18 & 1);
                auVar79._32_4_ = (uint)bVar1 * auVar72._32_4_ | (uint)!bVar1 * in_ZMM5._32_4_;
                bVar1 = (bool)((byte)(uVar43 >> 9) & 1);
                auVar79._36_4_ = (uint)bVar1 * auVar72._36_4_ | (uint)!bVar1 * in_ZMM5._36_4_;
                bVar1 = (bool)((byte)(uVar43 >> 10) & 1);
                auVar79._40_4_ = (uint)bVar1 * auVar72._40_4_ | (uint)!bVar1 * in_ZMM5._40_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xb) & 1);
                auVar79._44_4_ = (uint)bVar1 * auVar72._44_4_ | (uint)!bVar1 * in_ZMM5._44_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xc) & 1);
                auVar79._48_4_ = (uint)bVar1 * auVar72._48_4_ | (uint)!bVar1 * in_ZMM5._48_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xd) & 1);
                auVar79._52_4_ = (uint)bVar1 * auVar72._52_4_ | (uint)!bVar1 * in_ZMM5._52_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xe) & 1);
                auVar79._56_4_ = (uint)bVar1 * auVar72._56_4_ | (uint)!bVar1 * in_ZMM5._56_4_;
                bVar1 = SUB81(uVar43 >> 0xf,0);
                auVar79._60_4_ = (uint)bVar1 * auVar72._60_4_ | (uint)!bVar1 * in_ZMM5._60_4_;
                auVar72 = vmaxps_avx512f(auVar74,auVar59);
                auVar73 = vrcp14ps_avx512f(auVar72);
                auVar74 = vmulps_avx512f(auVar79,auVar73);
                uVar35 = vcmpps_avx512f(auVar76,auVar92,4);
                auVar72 = vfmsub213ps_avx512f(auVar72,auVar74,auVar79);
                auVar72 = vfnmadd213ps_avx512f(auVar72,auVar73,auVar74);
                in_ZMM5 = vmulps_avx512f(auVar72,auVar72);
                uVar36 = vcmpps_avx512f(auVar77,auVar92,4);
                auVar73 = vmulps_avx512f(in_ZMM5,in_ZMM5);
                auVar74 = vfmadd213ps_avx512f(auVar60,auVar73,auVar61);
                auVar74 = vfmadd213ps_avx512f(auVar74,auVar73,auVar62);
                auVar80 = vfmadd213ps_avx512f(auVar64,auVar73,auVar65);
                auVar80 = vfmadd213ps_avx512f(auVar80,auVar73,auVar66);
                auVar74 = vfmadd213ps_avx512f(auVar74,auVar73,auVar63);
                auVar80 = vfmadd213ps_avx512f(auVar80,auVar73,auVar67);
                auVar73 = vfmadd213ps_avx512f(auVar80,auVar73,auVar59);
                auVar73 = vfmadd231ps_avx512f(auVar73,in_ZMM5,auVar74);
                uVar37 = vcmpps_avx512f(auVar76,auVar92,1);
                auVar72 = vmulps_avx512f(auVar73,auVar72);
                auVar73 = vaddps_avx512f(auVar72,auVar68);
                bVar1 = (bool)((byte)uVar43 & 1);
                auVar81._0_4_ = (uint)bVar1 * auVar73._0_4_ | (uint)!bVar1 * auVar72._0_4_;
                bVar1 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar81._4_4_ = (uint)bVar1 * auVar73._4_4_ | (uint)!bVar1 * auVar72._4_4_;
                bVar1 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar81._8_4_ = (uint)bVar1 * auVar73._8_4_ | (uint)!bVar1 * auVar72._8_4_;
                bVar1 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar81._12_4_ = (uint)bVar1 * auVar73._12_4_ | (uint)!bVar1 * auVar72._12_4_;
                bVar1 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar81._16_4_ = (uint)bVar1 * auVar73._16_4_ | (uint)!bVar1 * auVar72._16_4_;
                bVar1 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar81._20_4_ = (uint)bVar1 * auVar73._20_4_ | (uint)!bVar1 * auVar72._20_4_;
                bVar1 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar81._24_4_ = (uint)bVar1 * auVar73._24_4_ | (uint)!bVar1 * auVar72._24_4_;
                bVar1 = (bool)((byte)(uVar43 >> 7) & 1);
                auVar81._28_4_ = (uint)bVar1 * auVar73._28_4_ | (uint)!bVar1 * auVar72._28_4_;
                bVar1 = (bool)(bVar18 & 1);
                auVar81._32_4_ = (uint)bVar1 * auVar73._32_4_ | (uint)!bVar1 * auVar72._32_4_;
                bVar1 = (bool)((byte)(uVar43 >> 9) & 1);
                auVar81._36_4_ = (uint)bVar1 * auVar73._36_4_ | (uint)!bVar1 * auVar72._36_4_;
                bVar1 = (bool)((byte)(uVar43 >> 10) & 1);
                auVar81._40_4_ = (uint)bVar1 * auVar73._40_4_ | (uint)!bVar1 * auVar72._40_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xb) & 1);
                auVar81._44_4_ = (uint)bVar1 * auVar73._44_4_ | (uint)!bVar1 * auVar72._44_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xc) & 1);
                auVar81._48_4_ = (uint)bVar1 * auVar73._48_4_ | (uint)!bVar1 * auVar72._48_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xd) & 1);
                auVar81._52_4_ = (uint)bVar1 * auVar73._52_4_ | (uint)!bVar1 * auVar72._52_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xe) & 1);
                auVar81._56_4_ = (uint)bVar1 * auVar73._56_4_ | (uint)!bVar1 * auVar72._56_4_;
                bVar1 = SUB81(uVar43 >> 0xf,0);
                auVar81._60_4_ = (uint)bVar1 * auVar73._60_4_ | (uint)!bVar1 * auVar72._60_4_;
                auVar71 = vpternlogd_avx512f(auVar81,auVar71,auVar56,0xf8);
                auVar72 = vaddps_avx512f(auVar71,auVar78);
                bVar1 = (bool)((byte)uVar37 & 1);
                bVar4 = (bool)((byte)(uVar37 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
                bVar10 = (bool)((byte)(uVar37 >> 4) & 1);
                bVar12 = (bool)((byte)(uVar37 >> 5) & 1);
                bVar14 = (bool)((byte)(uVar37 >> 6) & 1);
                bVar16 = (bool)((byte)(uVar37 >> 7) & 1);
                bVar19 = (bool)((byte)(uVar37 >> 8) & 1);
                bVar21 = (bool)((byte)(uVar37 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar37 >> 10) & 1);
                bVar25 = (bool)((byte)(uVar37 >> 0xb) & 1);
                bVar27 = (bool)((byte)(uVar37 >> 0xc) & 1);
                bVar29 = (bool)((byte)(uVar37 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                bVar33 = SUB81(uVar37 >> 0xf,0);
                auVar76 = vpternlogd_avx512f(auVar76,auVar56,auVar69,0xea);
                uVar43 = vcmpps_avx512f(auVar76,auVar92,1);
                auVar76 = vpternlogd_avx512f(auVar77,auVar56,auVar70,0xea);
                bVar2 = (bool)((byte)uVar35 & 1);
                bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar35 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar35 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar35 >> 5) & 1);
                bVar15 = (bool)((byte)(uVar35 >> 6) & 1);
                bVar17 = (bool)((byte)(uVar35 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar35 >> 8) & 1);
                bVar22 = (bool)((byte)(uVar35 >> 9) & 1);
                bVar24 = (bool)((byte)(uVar35 >> 10) & 1);
                bVar26 = (bool)((byte)(uVar35 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar35 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar35 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
                bVar34 = SUB81(uVar35 >> 0xf,0);
                bVar3 = (bool)((byte)uVar36 & 1);
                auVar82._0_4_ =
                     (uint)bVar3 *
                     ((uint)bVar2 * ((uint)bVar1 * auVar72._0_4_ | (uint)!bVar1 * auVar71._0_4_) |
                     (uint)!bVar2 * auVar76._0_4_) |
                     (uint)!bVar3 * (uint)((byte)uVar43 & 1) * auVar57._0_4_;
                bVar1 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar82._4_4_ =
                     (uint)bVar1 *
                     ((uint)bVar5 * ((uint)bVar4 * auVar72._4_4_ | (uint)!bVar4 * auVar71._4_4_) |
                     (uint)!bVar5 * auVar76._4_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 1) & 1) * auVar57._4_4_;
                bVar1 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar82._8_4_ =
                     (uint)bVar1 *
                     ((uint)bVar7 * ((uint)bVar6 * auVar72._8_4_ | (uint)!bVar6 * auVar71._8_4_) |
                     (uint)!bVar7 * auVar76._8_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 2) & 1) * auVar57._8_4_;
                bVar1 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar82._12_4_ =
                     (uint)bVar1 *
                     ((uint)bVar9 * ((uint)bVar8 * auVar72._12_4_ | (uint)!bVar8 * auVar71._12_4_) |
                     (uint)!bVar9 * auVar76._12_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 3) & 1) * auVar57._12_4_;
                bVar1 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar82._16_4_ =
                     (uint)bVar1 *
                     ((uint)bVar11 *
                      ((uint)bVar10 * auVar72._16_4_ | (uint)!bVar10 * auVar71._16_4_) |
                     (uint)!bVar11 * auVar76._16_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 4) & 1) * auVar57._16_4_;
                bVar1 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar82._20_4_ =
                     (uint)bVar1 *
                     ((uint)bVar13 *
                      ((uint)bVar12 * auVar72._20_4_ | (uint)!bVar12 * auVar71._20_4_) |
                     (uint)!bVar13 * auVar76._20_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 5) & 1) * auVar57._20_4_;
                bVar1 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar82._24_4_ =
                     (uint)bVar1 *
                     ((uint)bVar15 *
                      ((uint)bVar14 * auVar72._24_4_ | (uint)!bVar14 * auVar71._24_4_) |
                     (uint)!bVar15 * auVar76._24_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 6) & 1) * auVar57._24_4_;
                bVar1 = (bool)((byte)(uVar36 >> 7) & 1);
                auVar82._28_4_ =
                     (uint)bVar1 *
                     ((uint)bVar17 *
                      ((uint)bVar16 * auVar72._28_4_ | (uint)!bVar16 * auVar71._28_4_) |
                     (uint)!bVar17 * auVar76._28_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 7) & 1) * auVar57._28_4_;
                bVar1 = (bool)((byte)(uVar36 >> 8) & 1);
                auVar82._32_4_ =
                     (uint)bVar1 *
                     ((uint)bVar20 *
                      ((uint)bVar19 * auVar72._32_4_ | (uint)!bVar19 * auVar71._32_4_) |
                     (uint)!bVar20 * auVar76._32_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 8) & 1) * auVar57._32_4_;
                bVar1 = (bool)((byte)(uVar36 >> 9) & 1);
                auVar82._36_4_ =
                     (uint)bVar1 *
                     ((uint)bVar22 *
                      ((uint)bVar21 * auVar72._36_4_ | (uint)!bVar21 * auVar71._36_4_) |
                     (uint)!bVar22 * auVar76._36_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 9) & 1) * auVar57._36_4_;
                bVar1 = (bool)((byte)(uVar36 >> 10) & 1);
                auVar82._40_4_ =
                     (uint)bVar1 *
                     ((uint)bVar24 *
                      ((uint)bVar23 * auVar72._40_4_ | (uint)!bVar23 * auVar71._40_4_) |
                     (uint)!bVar24 * auVar76._40_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 10) & 1) * auVar57._40_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xb) & 1);
                auVar82._44_4_ =
                     (uint)bVar1 *
                     ((uint)bVar26 *
                      ((uint)bVar25 * auVar72._44_4_ | (uint)!bVar25 * auVar71._44_4_) |
                     (uint)!bVar26 * auVar76._44_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xb) & 1) * auVar57._44_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xc) & 1);
                auVar82._48_4_ =
                     (uint)bVar1 *
                     ((uint)bVar28 *
                      ((uint)bVar27 * auVar72._48_4_ | (uint)!bVar27 * auVar71._48_4_) |
                     (uint)!bVar28 * auVar76._48_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xc) & 1) * auVar57._48_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xd) & 1);
                auVar82._52_4_ =
                     (uint)bVar1 *
                     ((uint)bVar30 *
                      ((uint)bVar29 * auVar72._52_4_ | (uint)!bVar29 * auVar71._52_4_) |
                     (uint)!bVar30 * auVar76._52_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xd) & 1) * auVar57._52_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xe) & 1);
                auVar82._56_4_ =
                     (uint)bVar1 *
                     ((uint)bVar32 *
                      ((uint)bVar31 * auVar72._56_4_ | (uint)!bVar31 * auVar71._56_4_) |
                     (uint)!bVar32 * auVar76._56_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xe) & 1) * auVar57._56_4_;
                bVar1 = SUB81(uVar36 >> 0xf,0);
                auVar82._60_4_ =
                     (uint)bVar1 *
                     ((uint)bVar34 *
                      ((uint)bVar33 * auVar72._60_4_ | (uint)!bVar33 * auVar71._60_4_) |
                     (uint)!bVar34 * auVar76._60_4_) |
                     (uint)!bVar1 * (uint)(byte)(uVar43 >> 0xf) * auVar57._60_4_;
                pauVar47 = pauVar47 + 1;
                *pauVar51 = auVar82;
                pauVar49 = pauVar49 + 1;
                pauVar51 = pauVar51 + 1;
                iVar39 = iVar39 + 0x10;
              } while (iVar39 < (int)uVar41);
              uVar43 = local_128 & 0xffffffff;
            }
            local_13c = in_EAX;
            if ((int)((uint)uVar43 | 7) < (int)uVar41) {
              do {
                local_c0 = *(float (*) [2])*pauVar47;
                afStack_b8 = *(float (*) [2])(*pauVar47 + 8);
                afStack_b0 = *(float (*) [2])(*pauVar47 + 0x10);
                afStack_a8 = *(float (*) [2])(*pauVar47 + 0x18);
                auVar86 = *(undefined1 (*) [32])*pauVar49;
                local_100._0_4_ = auVar86._0_4_;
                local_100._4_4_ = auVar86._4_4_;
                local_100._8_4_ = auVar86._8_4_;
                local_100._12_4_ = auVar86._12_4_;
                local_100._16_4_ = auVar86._16_4_;
                local_100._20_4_ = auVar86._20_4_;
                local_100._24_4_ = auVar86._24_4_;
                local_100._28_4_ = auVar86._28_4_;
                BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack8
                          ((binary_op_atan2 *)&local_149,(__m256 *)local_c0,(__m256 *)local_100);
                *(undefined1 (*) [32])*pauVar51 = auVar86;
                pauVar47 = (undefined1 (*) [64])(*pauVar47 + 0x20);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar51 = (undefined1 (*) [64])((long)*pauVar51 + 0x20);
                iVar39 = (int)uVar43;
                uVar43 = (ulong)(iVar39 + 8);
                uVar41 = local_140;
              } while (iVar39 + 0xf < (int)local_140);
            }
            uVar40 = (uint)uVar43;
            if ((int)(uVar40 | 3) < (int)uVar41) {
              do {
                local_c0 = *(float (*) [2])*pauVar47;
                afStack_b8 = *(float (*) [2])(*pauVar47 + 8);
                local_100._0_16_ = *(undefined1 (*) [16])*pauVar49;
                auVar88 = ZEXT856(*(ulong *)(*pauVar49 + 8));
                in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                afVar93 = BinaryOp_x86_avx512_functor::binary_op_atan2::func_pack4
                                    ((binary_op_atan2 *)&local_149,(__m128 *)local_c0,
                                     (__m128 *)local_100);
                auVar57._0_8_ = afVar93._0_8_;
                auVar57._8_56_ = auVar88;
                *(undefined1 (*) [16])*pauVar51 = auVar57._0_16_;
                pauVar47 = (undefined1 (*) [64])(*pauVar47 + 0x10);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar51 = (undefined1 (*) [64])((long)*pauVar51 + 0x10);
                iVar39 = (int)uVar43;
                uVar40 = iVar39 + 4;
                uVar43 = (ulong)uVar40;
                uVar41 = local_140;
              } while (iVar39 + 7 < (int)local_140);
            }
            auVar55 = auVar92._0_16_;
            if ((int)uVar40 < (int)uVar41) {
              lVar52 = 0;
              lVar44 = 0;
              local_120 = pauVar47;
              do {
                in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                fVar83 = atan2f(*(float *)(*local_120 + lVar52 * 4),
                                *(float *)(*pauVar49 + lVar52 * 4));
                auVar55 = auVar92._0_16_;
                *(float *)((long)*pauVar51 + lVar52 * 4) = fVar83;
                lVar44 = lVar44 + -4;
                lVar52 = lVar52 + 1;
              } while (uVar41 - uVar40 != (int)lVar52);
              pauVar47 = (undefined1 (*) [64])((long)local_120 - lVar44);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar44);
              uVar50 = local_12c;
              uVar41 = local_140;
            }
            in_EAX = local_13c + 1;
            auVar56 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar57 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar58 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar59 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar60 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar61 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar62 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar63 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar64 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar65 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar66 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar67 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar68 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar69 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar70 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            auVar55 = vxorps_avx512vl(auVar55,auVar55);
            auVar92 = ZEXT1664(auVar55);
            b = local_110;
          } while (in_EAX != uVar50);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_108);
    }
    break;
  case 0xb:
    in_EAX = a->c;
    local_108 = (long)(int)in_EAX;
    if (0 < local_108) {
      uVar50 = a->h;
      uVar41 = a->w * a->elempack;
      in_EAX = uVar41 & 0xfffffff0;
      local_128 = CONCAT44(local_128._4_4_,uVar41) & 0xfffffffffffffff0;
      local_138 = 0;
      auVar56 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar58 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar59 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar60 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar61 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar62 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar63 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar64 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar65 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar66 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar67 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar68 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      auVar69 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar70 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar55 = vxorps_avx512vl(auVar55,auVar55);
      auVar92 = ZEXT1664(auVar55);
      local_140 = uVar41;
      local_12c = uVar50;
      do {
        if (0 < (int)uVar50) {
          pauVar51 = (undefined1 (*) [64])
                     (local_118->cstep * local_138 * local_118->elemsize + (long)local_118->data);
          pauVar47 = (undefined1 (*) [64])
                     (local_148->cstep * local_138 * local_148->elemsize + (long)local_148->data);
          in_EAX = 0;
          do {
            pauVar49 = (undefined1 (*) [64])(b->cstep * local_138 * b->elemsize + (long)b->data);
            if ((int)uVar41 < 0x10) {
              uVar43 = 0;
            }
            else {
              iVar39 = 0xf;
              do {
                auVar76 = *pauVar47;
                auVar71 = vrcp14ps_avx512f(auVar76);
                auVar77 = *pauVar49;
                auVar72 = vmulps_avx512f(auVar77,auVar71);
                auVar73 = vfmsub213ps_avx512f(auVar72,auVar76,auVar77);
                auVar73 = vfnmadd213ps_avx512f(auVar73,auVar71,auVar72);
                uVar43 = vcmpps_avx512f(auVar77,auVar92,1);
                auVar74 = vandps_avx512dq(auVar73,auVar58);
                auVar71._8_4_ = 0xc0490fdb;
                auVar71._0_8_ = 0xc0490fdbc0490fdb;
                auVar71._12_4_ = 0xc0490fdb;
                auVar71._16_4_ = 0xc0490fdb;
                auVar71._20_4_ = 0xc0490fdb;
                auVar71._24_4_ = 0xc0490fdb;
                auVar71._28_4_ = 0xc0490fdb;
                auVar71._32_4_ = 0xc0490fdb;
                auVar71._36_4_ = 0xc0490fdb;
                auVar71._40_4_ = 0xc0490fdb;
                auVar71._44_4_ = 0xc0490fdb;
                auVar71._48_4_ = 0xc0490fdb;
                auVar71._52_4_ = 0xc0490fdb;
                auVar71._56_4_ = 0xc0490fdb;
                auVar71._60_4_ = 0xc0490fdb;
                auVar71 = vblendmps_avx512f(auVar57,auVar71);
                bVar1 = (bool)((byte)uVar43 & 1);
                auVar80._0_4_ = (uint)bVar1 * auVar71._0_4_ | (uint)!bVar1 * auVar72._0_4_;
                bVar1 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar80._4_4_ = (uint)bVar1 * auVar71._4_4_ | (uint)!bVar1 * auVar72._4_4_;
                bVar1 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar80._8_4_ = (uint)bVar1 * auVar71._8_4_ | (uint)!bVar1 * auVar72._8_4_;
                bVar1 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar80._12_4_ = (uint)bVar1 * auVar71._12_4_ | (uint)!bVar1 * auVar72._12_4_;
                bVar1 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar80._16_4_ = (uint)bVar1 * auVar71._16_4_ | (uint)!bVar1 * auVar72._16_4_;
                bVar1 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar80._20_4_ = (uint)bVar1 * auVar71._20_4_ | (uint)!bVar1 * auVar72._20_4_;
                bVar1 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar80._24_4_ = (uint)bVar1 * auVar71._24_4_ | (uint)!bVar1 * auVar72._24_4_;
                bVar1 = (bool)((byte)(uVar43 >> 7) & 1);
                auVar80._28_4_ = (uint)bVar1 * auVar71._28_4_ | (uint)!bVar1 * auVar72._28_4_;
                bVar1 = (bool)((byte)(uVar43 >> 8) & 1);
                auVar80._32_4_ = (uint)bVar1 * auVar71._32_4_ | (uint)!bVar1 * auVar72._32_4_;
                bVar1 = (bool)((byte)(uVar43 >> 9) & 1);
                auVar80._36_4_ = (uint)bVar1 * auVar71._36_4_ | (uint)!bVar1 * auVar72._36_4_;
                bVar1 = (bool)((byte)(uVar43 >> 10) & 1);
                auVar80._40_4_ = (uint)bVar1 * auVar71._40_4_ | (uint)!bVar1 * auVar72._40_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xb) & 1);
                auVar80._44_4_ = (uint)bVar1 * auVar71._44_4_ | (uint)!bVar1 * auVar72._44_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xc) & 1);
                auVar80._48_4_ = (uint)bVar1 * auVar71._48_4_ | (uint)!bVar1 * auVar72._48_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xd) & 1);
                auVar80._52_4_ = (uint)bVar1 * auVar71._52_4_ | (uint)!bVar1 * auVar72._52_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xe) & 1);
                auVar80._56_4_ = (uint)bVar1 * auVar71._56_4_ | (uint)!bVar1 * auVar72._56_4_;
                bVar1 = SUB81(uVar43 >> 0xf,0);
                auVar80._60_4_ = (uint)bVar1 * auVar71._60_4_ | (uint)!bVar1 * auVar72._60_4_;
                uVar43 = vcmpps_avx512f(auVar59,auVar74,1);
                auVar72._8_4_ = 0xbf800000;
                auVar72._0_8_ = 0xbf800000bf800000;
                auVar72._12_4_ = 0xbf800000;
                auVar72._16_4_ = 0xbf800000;
                auVar72._20_4_ = 0xbf800000;
                auVar72._24_4_ = 0xbf800000;
                auVar72._28_4_ = 0xbf800000;
                auVar72._32_4_ = 0xbf800000;
                auVar72._36_4_ = 0xbf800000;
                auVar72._40_4_ = 0xbf800000;
                auVar72._44_4_ = 0xbf800000;
                auVar72._48_4_ = 0xbf800000;
                auVar72._52_4_ = 0xbf800000;
                auVar72._56_4_ = 0xbf800000;
                auVar72._60_4_ = 0xbf800000;
                auVar71 = vblendmps_avx512f(auVar74,auVar72);
                bVar1 = (bool)((byte)uVar43 & 1);
                auVar75._0_4_ = (uint)bVar1 * auVar71._0_4_ | (uint)!bVar1 * in_ZMM5._0_4_;
                bVar1 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar75._4_4_ = (uint)bVar1 * auVar71._4_4_ | (uint)!bVar1 * in_ZMM5._4_4_;
                bVar1 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar75._8_4_ = (uint)bVar1 * auVar71._8_4_ | (uint)!bVar1 * in_ZMM5._8_4_;
                bVar1 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar75._12_4_ = (uint)bVar1 * auVar71._12_4_ | (uint)!bVar1 * in_ZMM5._12_4_;
                bVar1 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar75._16_4_ = (uint)bVar1 * auVar71._16_4_ | (uint)!bVar1 * in_ZMM5._16_4_;
                bVar1 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar75._20_4_ = (uint)bVar1 * auVar71._20_4_ | (uint)!bVar1 * in_ZMM5._20_4_;
                bVar1 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar75._24_4_ = (uint)bVar1 * auVar71._24_4_ | (uint)!bVar1 * in_ZMM5._24_4_;
                bVar1 = (bool)((byte)(uVar43 >> 7) & 1);
                auVar75._28_4_ = (uint)bVar1 * auVar71._28_4_ | (uint)!bVar1 * in_ZMM5._28_4_;
                bVar18 = (byte)(uVar43 >> 8);
                bVar1 = (bool)(bVar18 & 1);
                auVar75._32_4_ = (uint)bVar1 * auVar71._32_4_ | (uint)!bVar1 * in_ZMM5._32_4_;
                bVar1 = (bool)((byte)(uVar43 >> 9) & 1);
                auVar75._36_4_ = (uint)bVar1 * auVar71._36_4_ | (uint)!bVar1 * in_ZMM5._36_4_;
                bVar1 = (bool)((byte)(uVar43 >> 10) & 1);
                auVar75._40_4_ = (uint)bVar1 * auVar71._40_4_ | (uint)!bVar1 * in_ZMM5._40_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xb) & 1);
                auVar75._44_4_ = (uint)bVar1 * auVar71._44_4_ | (uint)!bVar1 * in_ZMM5._44_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xc) & 1);
                auVar75._48_4_ = (uint)bVar1 * auVar71._48_4_ | (uint)!bVar1 * in_ZMM5._48_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xd) & 1);
                auVar75._52_4_ = (uint)bVar1 * auVar71._52_4_ | (uint)!bVar1 * in_ZMM5._52_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xe) & 1);
                auVar75._56_4_ = (uint)bVar1 * auVar71._56_4_ | (uint)!bVar1 * in_ZMM5._56_4_;
                bVar1 = SUB81(uVar43 >> 0xf,0);
                auVar75._60_4_ = (uint)bVar1 * auVar71._60_4_ | (uint)!bVar1 * in_ZMM5._60_4_;
                auVar71 = vmaxps_avx512f(auVar74,auVar59);
                auVar72 = vrcp14ps_avx512f(auVar71);
                auVar74 = vmulps_avx512f(auVar75,auVar72);
                uVar35 = vcmpps_avx512f(auVar76,auVar92,4);
                auVar71 = vfmsub213ps_avx512f(auVar71,auVar74,auVar75);
                auVar71 = vfnmadd213ps_avx512f(auVar71,auVar72,auVar74);
                in_ZMM5 = vmulps_avx512f(auVar71,auVar71);
                uVar36 = vcmpps_avx512f(auVar77,auVar92,4);
                auVar72 = vmulps_avx512f(in_ZMM5,in_ZMM5);
                auVar74 = vfmadd213ps_avx512f(auVar60,auVar72,auVar61);
                auVar74 = vfmadd213ps_avx512f(auVar74,auVar72,auVar62);
                auVar75 = vfmadd213ps_avx512f(auVar64,auVar72,auVar65);
                auVar75 = vfmadd213ps_avx512f(auVar75,auVar72,auVar66);
                auVar74 = vfmadd213ps_avx512f(auVar74,auVar72,auVar63);
                auVar75 = vfmadd213ps_avx512f(auVar75,auVar72,auVar67);
                auVar72 = vfmadd213ps_avx512f(auVar75,auVar72,auVar59);
                auVar72 = vfmadd231ps_avx512f(auVar72,in_ZMM5,auVar74);
                uVar37 = vcmpps_avx512f(auVar76,auVar92,1);
                auVar71 = vmulps_avx512f(auVar72,auVar71);
                auVar72 = vaddps_avx512f(auVar71,auVar68);
                bVar1 = (bool)((byte)uVar43 & 1);
                auVar74._0_4_ = (uint)bVar1 * auVar72._0_4_ | (uint)!bVar1 * auVar71._0_4_;
                bVar1 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar74._4_4_ = (uint)bVar1 * auVar72._4_4_ | (uint)!bVar1 * auVar71._4_4_;
                bVar1 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar74._8_4_ = (uint)bVar1 * auVar72._8_4_ | (uint)!bVar1 * auVar71._8_4_;
                bVar1 = (bool)((byte)(uVar43 >> 3) & 1);
                auVar74._12_4_ = (uint)bVar1 * auVar72._12_4_ | (uint)!bVar1 * auVar71._12_4_;
                bVar1 = (bool)((byte)(uVar43 >> 4) & 1);
                auVar74._16_4_ = (uint)bVar1 * auVar72._16_4_ | (uint)!bVar1 * auVar71._16_4_;
                bVar1 = (bool)((byte)(uVar43 >> 5) & 1);
                auVar74._20_4_ = (uint)bVar1 * auVar72._20_4_ | (uint)!bVar1 * auVar71._20_4_;
                bVar1 = (bool)((byte)(uVar43 >> 6) & 1);
                auVar74._24_4_ = (uint)bVar1 * auVar72._24_4_ | (uint)!bVar1 * auVar71._24_4_;
                bVar1 = (bool)((byte)(uVar43 >> 7) & 1);
                auVar74._28_4_ = (uint)bVar1 * auVar72._28_4_ | (uint)!bVar1 * auVar71._28_4_;
                bVar1 = (bool)(bVar18 & 1);
                auVar74._32_4_ = (uint)bVar1 * auVar72._32_4_ | (uint)!bVar1 * auVar71._32_4_;
                bVar1 = (bool)((byte)(uVar43 >> 9) & 1);
                auVar74._36_4_ = (uint)bVar1 * auVar72._36_4_ | (uint)!bVar1 * auVar71._36_4_;
                bVar1 = (bool)((byte)(uVar43 >> 10) & 1);
                auVar74._40_4_ = (uint)bVar1 * auVar72._40_4_ | (uint)!bVar1 * auVar71._40_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xb) & 1);
                auVar74._44_4_ = (uint)bVar1 * auVar72._44_4_ | (uint)!bVar1 * auVar71._44_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xc) & 1);
                auVar74._48_4_ = (uint)bVar1 * auVar72._48_4_ | (uint)!bVar1 * auVar71._48_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xd) & 1);
                auVar74._52_4_ = (uint)bVar1 * auVar72._52_4_ | (uint)!bVar1 * auVar71._52_4_;
                bVar1 = (bool)((byte)(uVar43 >> 0xe) & 1);
                auVar74._56_4_ = (uint)bVar1 * auVar72._56_4_ | (uint)!bVar1 * auVar71._56_4_;
                bVar1 = SUB81(uVar43 >> 0xf,0);
                auVar74._60_4_ = (uint)bVar1 * auVar72._60_4_ | (uint)!bVar1 * auVar71._60_4_;
                auVar71 = vpternlogd_avx512f(auVar74,auVar73,auVar56,0xf8);
                auVar72 = vaddps_avx512f(auVar71,auVar80);
                bVar1 = (bool)((byte)uVar37 & 1);
                bVar4 = (bool)((byte)(uVar37 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
                bVar10 = (bool)((byte)(uVar37 >> 4) & 1);
                bVar12 = (bool)((byte)(uVar37 >> 5) & 1);
                bVar14 = (bool)((byte)(uVar37 >> 6) & 1);
                bVar16 = (bool)((byte)(uVar37 >> 7) & 1);
                bVar19 = (bool)((byte)(uVar37 >> 8) & 1);
                bVar21 = (bool)((byte)(uVar37 >> 9) & 1);
                bVar23 = (bool)((byte)(uVar37 >> 10) & 1);
                bVar25 = (bool)((byte)(uVar37 >> 0xb) & 1);
                bVar27 = (bool)((byte)(uVar37 >> 0xc) & 1);
                bVar29 = (bool)((byte)(uVar37 >> 0xd) & 1);
                bVar31 = (bool)((byte)(uVar37 >> 0xe) & 1);
                bVar33 = SUB81(uVar37 >> 0xf,0);
                auVar76 = vpternlogd_avx512f(auVar76,auVar56,auVar69,0xea);
                uVar43 = vcmpps_avx512f(auVar76,auVar92,1);
                auVar76 = vpternlogd_avx512f(auVar77,auVar56,auVar70,0xea);
                bVar2 = (bool)((byte)uVar35 & 1);
                bVar5 = (bool)((byte)(uVar35 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar35 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar35 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar35 >> 4) & 1);
                bVar13 = (bool)((byte)(uVar35 >> 5) & 1);
                bVar15 = (bool)((byte)(uVar35 >> 6) & 1);
                bVar17 = (bool)((byte)(uVar35 >> 7) & 1);
                bVar20 = (bool)((byte)(uVar35 >> 8) & 1);
                bVar22 = (bool)((byte)(uVar35 >> 9) & 1);
                bVar24 = (bool)((byte)(uVar35 >> 10) & 1);
                bVar26 = (bool)((byte)(uVar35 >> 0xb) & 1);
                bVar28 = (bool)((byte)(uVar35 >> 0xc) & 1);
                bVar30 = (bool)((byte)(uVar35 >> 0xd) & 1);
                bVar32 = (bool)((byte)(uVar35 >> 0xe) & 1);
                bVar34 = SUB81(uVar35 >> 0xf,0);
                bVar3 = (bool)((byte)uVar36 & 1);
                auVar77._0_4_ =
                     (uint)bVar3 *
                     ((uint)bVar2 * ((uint)bVar1 * auVar72._0_4_ | (uint)!bVar1 * auVar71._0_4_) |
                     (uint)!bVar2 * auVar76._0_4_) |
                     (uint)!bVar3 * (uint)((byte)uVar43 & 1) * auVar57._0_4_;
                bVar1 = (bool)((byte)(uVar36 >> 1) & 1);
                auVar77._4_4_ =
                     (uint)bVar1 *
                     ((uint)bVar5 * ((uint)bVar4 * auVar72._4_4_ | (uint)!bVar4 * auVar71._4_4_) |
                     (uint)!bVar5 * auVar76._4_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 1) & 1) * auVar57._4_4_;
                bVar1 = (bool)((byte)(uVar36 >> 2) & 1);
                auVar77._8_4_ =
                     (uint)bVar1 *
                     ((uint)bVar7 * ((uint)bVar6 * auVar72._8_4_ | (uint)!bVar6 * auVar71._8_4_) |
                     (uint)!bVar7 * auVar76._8_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 2) & 1) * auVar57._8_4_;
                bVar1 = (bool)((byte)(uVar36 >> 3) & 1);
                auVar77._12_4_ =
                     (uint)bVar1 *
                     ((uint)bVar9 * ((uint)bVar8 * auVar72._12_4_ | (uint)!bVar8 * auVar71._12_4_) |
                     (uint)!bVar9 * auVar76._12_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 3) & 1) * auVar57._12_4_;
                bVar1 = (bool)((byte)(uVar36 >> 4) & 1);
                auVar77._16_4_ =
                     (uint)bVar1 *
                     ((uint)bVar11 *
                      ((uint)bVar10 * auVar72._16_4_ | (uint)!bVar10 * auVar71._16_4_) |
                     (uint)!bVar11 * auVar76._16_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 4) & 1) * auVar57._16_4_;
                bVar1 = (bool)((byte)(uVar36 >> 5) & 1);
                auVar77._20_4_ =
                     (uint)bVar1 *
                     ((uint)bVar13 *
                      ((uint)bVar12 * auVar72._20_4_ | (uint)!bVar12 * auVar71._20_4_) |
                     (uint)!bVar13 * auVar76._20_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 5) & 1) * auVar57._20_4_;
                bVar1 = (bool)((byte)(uVar36 >> 6) & 1);
                auVar77._24_4_ =
                     (uint)bVar1 *
                     ((uint)bVar15 *
                      ((uint)bVar14 * auVar72._24_4_ | (uint)!bVar14 * auVar71._24_4_) |
                     (uint)!bVar15 * auVar76._24_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 6) & 1) * auVar57._24_4_;
                bVar1 = (bool)((byte)(uVar36 >> 7) & 1);
                auVar77._28_4_ =
                     (uint)bVar1 *
                     ((uint)bVar17 *
                      ((uint)bVar16 * auVar72._28_4_ | (uint)!bVar16 * auVar71._28_4_) |
                     (uint)!bVar17 * auVar76._28_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 7) & 1) * auVar57._28_4_;
                bVar1 = (bool)((byte)(uVar36 >> 8) & 1);
                auVar77._32_4_ =
                     (uint)bVar1 *
                     ((uint)bVar20 *
                      ((uint)bVar19 * auVar72._32_4_ | (uint)!bVar19 * auVar71._32_4_) |
                     (uint)!bVar20 * auVar76._32_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 8) & 1) * auVar57._32_4_;
                bVar1 = (bool)((byte)(uVar36 >> 9) & 1);
                auVar77._36_4_ =
                     (uint)bVar1 *
                     ((uint)bVar22 *
                      ((uint)bVar21 * auVar72._36_4_ | (uint)!bVar21 * auVar71._36_4_) |
                     (uint)!bVar22 * auVar76._36_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 9) & 1) * auVar57._36_4_;
                bVar1 = (bool)((byte)(uVar36 >> 10) & 1);
                auVar77._40_4_ =
                     (uint)bVar1 *
                     ((uint)bVar24 *
                      ((uint)bVar23 * auVar72._40_4_ | (uint)!bVar23 * auVar71._40_4_) |
                     (uint)!bVar24 * auVar76._40_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 10) & 1) * auVar57._40_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xb) & 1);
                auVar77._44_4_ =
                     (uint)bVar1 *
                     ((uint)bVar26 *
                      ((uint)bVar25 * auVar72._44_4_ | (uint)!bVar25 * auVar71._44_4_) |
                     (uint)!bVar26 * auVar76._44_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xb) & 1) * auVar57._44_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xc) & 1);
                auVar77._48_4_ =
                     (uint)bVar1 *
                     ((uint)bVar28 *
                      ((uint)bVar27 * auVar72._48_4_ | (uint)!bVar27 * auVar71._48_4_) |
                     (uint)!bVar28 * auVar76._48_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xc) & 1) * auVar57._48_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xd) & 1);
                auVar77._52_4_ =
                     (uint)bVar1 *
                     ((uint)bVar30 *
                      ((uint)bVar29 * auVar72._52_4_ | (uint)!bVar29 * auVar71._52_4_) |
                     (uint)!bVar30 * auVar76._52_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xd) & 1) * auVar57._52_4_;
                bVar1 = (bool)((byte)(uVar36 >> 0xe) & 1);
                auVar77._56_4_ =
                     (uint)bVar1 *
                     ((uint)bVar32 *
                      ((uint)bVar31 * auVar72._56_4_ | (uint)!bVar31 * auVar71._56_4_) |
                     (uint)!bVar32 * auVar76._56_4_) |
                     (uint)!bVar1 * (uint)((byte)(uVar43 >> 0xe) & 1) * auVar57._56_4_;
                bVar1 = SUB81(uVar36 >> 0xf,0);
                auVar77._60_4_ =
                     (uint)bVar1 *
                     ((uint)bVar34 *
                      ((uint)bVar33 * auVar72._60_4_ | (uint)!bVar33 * auVar71._60_4_) |
                     (uint)!bVar34 * auVar76._60_4_) |
                     (uint)!bVar1 * (uint)(byte)(uVar43 >> 0xf) * auVar57._60_4_;
                pauVar47 = pauVar47 + 1;
                *pauVar51 = auVar77;
                pauVar49 = pauVar49 + 1;
                pauVar51 = pauVar51 + 1;
                iVar39 = iVar39 + 0x10;
              } while (iVar39 < (int)uVar41);
              uVar43 = local_128 & 0xffffffff;
            }
            local_13c = in_EAX;
            if ((int)((uint)uVar43 | 7) < (int)uVar41) {
              do {
                local_c0 = *(float (*) [2])*pauVar47;
                afStack_b8 = *(float (*) [2])(*pauVar47 + 8);
                afStack_b0 = *(float (*) [2])(*pauVar47 + 0x10);
                afStack_a8 = *(float (*) [2])(*pauVar47 + 0x18);
                auVar86 = *(undefined1 (*) [32])*pauVar49;
                local_100._0_4_ = auVar86._0_4_;
                local_100._4_4_ = auVar86._4_4_;
                local_100._8_4_ = auVar86._8_4_;
                local_100._12_4_ = auVar86._12_4_;
                local_100._16_4_ = auVar86._16_4_;
                local_100._20_4_ = auVar86._20_4_;
                local_100._24_4_ = auVar86._24_4_;
                local_100._28_4_ = auVar86._28_4_;
                BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack8
                          (&local_149,(__m256 *)local_c0,(__m256 *)local_100);
                *(undefined1 (*) [32])*pauVar51 = auVar86;
                pauVar47 = (undefined1 (*) [64])(*pauVar47 + 0x20);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar51 = (undefined1 (*) [64])((long)*pauVar51 + 0x20);
                iVar39 = (int)uVar43;
                uVar43 = (ulong)(iVar39 + 8);
                uVar41 = local_140;
              } while (iVar39 + 0xf < (int)local_140);
            }
            uVar40 = (uint)uVar43;
            if ((int)(uVar40 | 3) < (int)uVar41) {
              do {
                local_c0 = *(float (*) [2])*pauVar47;
                afStack_b8 = *(float (*) [2])(*pauVar47 + 8);
                local_100._0_16_ = *(undefined1 (*) [16])*pauVar49;
                auVar88 = ZEXT856(*(ulong *)(*pauVar49 + 8));
                in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                afVar93 = BinaryOp_x86_avx512_functor::binary_op_ratan2::func_pack4
                                    (&local_149,(__m128 *)local_c0,(__m128 *)local_100);
                auVar56._0_8_ = afVar93._0_8_;
                auVar56._8_56_ = auVar88;
                *(undefined1 (*) [16])*pauVar51 = auVar56._0_16_;
                pauVar47 = (undefined1 (*) [64])(*pauVar47 + 0x10);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar51 = (undefined1 (*) [64])((long)*pauVar51 + 0x10);
                iVar39 = (int)uVar43;
                uVar40 = iVar39 + 4;
                uVar43 = (ulong)uVar40;
                uVar41 = local_140;
              } while (iVar39 + 7 < (int)local_140);
            }
            auVar55 = auVar92._0_16_;
            if ((int)uVar40 < (int)uVar41) {
              lVar52 = 0;
              lVar44 = 0;
              local_120 = pauVar47;
              do {
                in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                fVar83 = atan2f(*(float *)(*pauVar49 + lVar52 * 4),
                                *(float *)(*local_120 + lVar52 * 4));
                auVar55 = auVar92._0_16_;
                *(float *)((long)*pauVar51 + lVar52 * 4) = fVar83;
                lVar44 = lVar44 + -4;
                lVar52 = lVar52 + 1;
              } while (uVar41 - uVar40 != (int)lVar52);
              pauVar47 = (undefined1 (*) [64])((long)local_120 - lVar44);
              pauVar51 = (undefined1 (*) [64])((long)pauVar51 - lVar44);
              uVar50 = local_12c;
              uVar41 = local_140;
            }
            in_EAX = local_13c + 1;
            auVar56 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar57 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar58 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar59 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar60 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar61 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar62 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar63 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar64 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar65 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar66 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar67 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar68 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar69 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar70 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            auVar55 = vxorps_avx512vl(auVar55,auVar55);
            auVar92 = ZEXT1664(auVar55);
            b = local_110;
          } while (in_EAX != uVar50);
        }
        local_138 = local_138 + 1;
      } while (local_138 != local_108);
    }
  }
  return in_EAX;
}

Assistant:

static int binary_op_broadcast_20(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    if (op_type == BinaryOp::Operation_ADD) return binary_op_broadcast_20<binary_op_add>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_broadcast_20<binary_op_sub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_broadcast_20<binary_op_mul>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_broadcast_20<binary_op_div>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_broadcast_20<binary_op_max>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_broadcast_20<binary_op_min>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_broadcast_20<binary_op_pow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_broadcast_20<binary_op_rsub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_broadcast_20<binary_op_rdiv>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_broadcast_20<binary_op_rpow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_broadcast_20<binary_op_atan2>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_broadcast_20<binary_op_ratan2>(a, b, c, opt);

    // should never reach here
    return 0;
}